

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsViewPrivate::updateScroll(QGraphicsViewPrivate *this)

{
  QWidget *this_00;
  LayoutDirection LVar1;
  int iVar2;
  long lVar3;
  
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  this->scrollX = (long)-this->leftIndent;
  LVar1 = QWidget::layoutDirection(this_00);
  if (LVar1 == RightToLeft) {
    if ((this->leftIndent != 0.0) || (NAN(this->leftIndent))) goto LAB_0062d2af;
    iVar2 = QAbstractSlider::minimum
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    this->scrollX = this->scrollX + (long)iVar2;
    iVar2 = QAbstractSlider::maximum
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    this->scrollX = this->scrollX + (long)iVar2;
    iVar2 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    lVar3 = this->scrollX - (long)iVar2;
  }
  else {
    iVar2 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    lVar3 = (long)iVar2 + this->scrollX;
  }
  this->scrollX = lVar3;
LAB_0062d2af:
  iVar2 = QAbstractSlider::value
                    (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
  this->scrollY = (long)((double)iVar2 - this->topIndent);
  this->field_0x300 = this->field_0x300 & 0xdf;
  return;
}

Assistant:

void QGraphicsViewPrivate::updateScroll()
{
    Q_Q(QGraphicsView);
    scrollX = qint64(-leftIndent);
    if (q->isRightToLeft()) {
        if (!leftIndent) {
            scrollX += hbar->minimum();
            scrollX += hbar->maximum();
            scrollX -= hbar->value();
        }
    } else {
        scrollX += hbar->value();
    }

    scrollY = qint64(vbar->value() - topIndent);

    dirtyScroll = false;
}